

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDTree.hpp
# Opt level: O2

void __thiscall
kdtree::
KDTree<int,_5U,_kdtree::default_new<int,_5>,_kdtree::default_delete<int>,_kdtree::default_set<int>,_kdtree::default_less<int>_>
::updateBoundingBox(KDTree<int,_5U,_kdtree::default_new<int,_5>,_kdtree::default_delete<int>,_kdtree::default_set<int>,_kdtree::default_less<int>_>
                    *this,Node *node)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  int *piVar4;
  long lVar5;
  long lVar6;
  int *piVar7;
  
  piVar2 = node->value;
  piVar3 = this->boundingBoxMin;
  piVar4 = this->boundingBoxMax;
  lVar5 = 0;
  lVar6 = 0;
  do {
    if (lVar5 == 0x14) {
      return;
    }
    iVar1 = *(int *)((long)piVar2 + lVar5);
    if (iVar1 < *(int *)((long)piVar3 + lVar5)) {
      piVar7 = (int *)((long)piVar3 + lVar5);
LAB_001039f2:
      *piVar7 = iVar1;
    }
    else if (*(int *)((long)piVar4 + lVar5) < iVar1) {
      piVar7 = piVar4 + lVar6;
      goto LAB_001039f2;
    }
    lVar6 = lVar6 + 1;
    lVar5 = lVar5 + 4;
  } while( true );
}

Assistant:

void updateBoundingBox(const Node * const node) {
			for (int d = 0; d < dim; d++) {
				if (LESS()(node->value, boundingBoxMin, d)) {
					SET()(boundingBoxMin, node->value, d);
				}
				else if (LESS()(boundingBoxMax, node->value, d)) {
					SET()(boundingBoxMax, node->value, d);
				}
			}
		}